

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall tcu::Texture2DArray::allocLevel(Texture2DArray *this,int levelNdx)

{
  int width_00;
  int height_00;
  int height;
  int width;
  int levelNdx_local;
  Texture2DArray *this_local;
  
  width_00 = getMipPyramidLevelSize(this->m_width,levelNdx);
  height_00 = getMipPyramidLevelSize(this->m_height,levelNdx);
  TextureLevelPyramid::allocLevel
            (&this->super_TextureLevelPyramid,levelNdx,width_00,height_00,this->m_numLayers);
  return;
}

Assistant:

void Texture2DArray::allocLevel (int levelNdx)
{
	DE_ASSERT(de::inBounds(levelNdx, 0, getNumLevels()));

	const int	width	= getMipPyramidLevelSize(m_width,	levelNdx);
	const int	height	= getMipPyramidLevelSize(m_height,	levelNdx);

	TextureLevelPyramid::allocLevel(levelNdx, width, height, m_numLayers);
}